

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  uint uVar1;
  int iVar2;
  ManualCompaction *pMVar3;
  pointer ppFVar4;
  Logger *pLVar5;
  InternalKey *this_00;
  FileMetaData *pFVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  InternalKey *this_01;
  bool bVar9;
  char *pcVar10;
  CompactionState *compact;
  _Alloc_hider _Var11;
  Status SVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  Status status;
  LevelSummaryStorage tmp;
  InternalKey manual_end;
  Compaction *local_150;
  Status local_128;
  undefined1 local_120 [32];
  undefined1 local_100 [104];
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (this->imm_ != (MemTable *)0x0) {
    if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) ==
        (__pthread_internal_list *)local_58._32_8_) {
      CompactMemTable(this);
      return;
    }
    goto LAB_00ceed52;
  }
  pMVar3 = this->manual_compaction_;
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = (pointer)0x0;
  local_58[0x10] = '\0';
  if (pMVar3 == (ManualCompaction *)0x0) {
    local_150 = VersionSet::PickCompaction(this->versions_);
    local_128.state_ = (char *)0x0;
    if (local_150 != (Compaction *)0x0) {
      bVar9 = Compaction::IsTrivialMove(local_150);
      if (!bVar9) goto LAB_00cee9f9;
      ppFVar4 = local_150->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((long)local_150->inputs_[0].
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 & 0x7fffffff8U) != 8) {
        __assert_fail("c->num_input_files(0) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x2da,"void leveldb::DBImpl::BackgroundCompaction()");
      }
      pFVar6 = *ppFVar4;
      local_100._8_8_ = pFVar6->number;
      local_100._0_4_ = local_150->level_;
      std::
      _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
      ::_M_insert_unique<std::pair<int,unsigned_long>>
                ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                  *)&(local_150->edit_).deleted_files_,(pair<int,_unsigned_long> *)local_100);
      VersionEdit::AddFile
                (&local_150->edit_,local_150->level_ + 1,pFVar6->number,pFVar6->file_size,
                 &pFVar6->smallest,&pFVar6->largest);
      VersionSet::LogAndApply
                ((VersionSet *)local_100,(VersionEdit *)this->versions_,(Mutex *)&local_150->edit_);
      SVar12.state_ = local_128.state_;
      local_128.state_ = (char *)local_100._0_8_;
      local_100._0_8_ = SVar12.state_;
      if (SVar12.state_ != (char *)0x0) {
        operator_delete__(SVar12.state_);
      }
      if (local_128.state_ != (pointer)0x0) {
        RecordBackgroundError(this,&local_128);
      }
      pLVar5 = (this->options_).info_log;
      uVar7 = pFVar6->number;
      uVar8 = pFVar6->file_size;
      iVar2 = local_150->level_;
      Status::ToString_abi_cxx11_((string *)&local_78,&local_128);
      uVar13 = local_78._M_allocated_capacity;
      pcVar10 = VersionSet::LevelSummary(this->versions_,(LevelSummaryStorage *)local_100);
      Log(pLVar5,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar7,(ulong)(iVar2 + 1),uVar8,uVar13
          ,pcVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != &local_68) {
        operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
      }
      goto LAB_00ceea85;
    }
LAB_00ceea94:
    local_128.state_ = (pointer)0x0;
    local_150 = (Compaction *)0x0;
  }
  else {
    local_150 = VersionSet::CompactRange(this->versions_,pMVar3->level,pMVar3->begin,pMVar3->end);
    pMVar3->done = local_150 == (Compaction *)0x0;
    if (local_150 != (Compaction *)0x0) {
      ppFVar4 = local_150->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &(ppFVar4[((long)local_150->inputs_[0].
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4) *
                           0x20000000 + -0x100000000 >> 0x20]->largest).rep_);
    }
    pLVar5 = (this->options_).info_log;
    uVar1 = pMVar3->level;
    this_00 = pMVar3->begin;
    if (this_00 == (InternalKey *)0x0) {
      pcVar10 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)local_100,this_00);
      pcVar10 = (char *)local_100._0_8_;
    }
    this_01 = pMVar3->end;
    uVar13 = "(end)";
    if (this_01 != (InternalKey *)0x0) {
      InternalKey::DebugString_abi_cxx11_((string *)&local_78,this_01);
      uVar13 = local_78._M_allocated_capacity;
    }
    bVar9 = pMVar3->done;
    _Var11._M_p = "(end)";
    if (bVar9 == false) {
      InternalKey::DebugString_abi_cxx11_(&local_98,(InternalKey *)local_58);
      _Var11._M_p = local_98._M_dataplus._M_p;
    }
    Log(pLVar5,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",(ulong)uVar1,pcVar10
        ,uVar13,_Var11._M_p);
    if ((bVar9 == false) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2)) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((this_01 != (InternalKey *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68)) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
    if ((this_00 != (InternalKey *)0x0) && ((undefined1 *)local_100._0_8_ != local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    local_128.state_ = (char *)0x0;
    if (local_150 == (Compaction *)0x0) goto LAB_00ceea94;
LAB_00cee9f9:
    compact = (CompactionState *)operator_new(0x40);
    compact->compaction = local_150;
    compact->smallest_snapshot = 0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (compact->outputs).
    super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    compact->outfile = (WritableFile *)0x0;
    compact->builder = (TableBuilder *)0x0;
    compact->total_bytes = 0;
    DoCompactionWork((DBImpl *)local_120,(CompactionState *)this);
    SVar12.state_ = local_128.state_;
    local_128.state_ = (char *)local_120._0_8_;
    if (SVar12.state_ != (char *)0x0) {
      operator_delete__(SVar12.state_);
    }
    if (local_128.state_ != (pointer)0x0) {
      RecordBackgroundError(this,&local_128);
    }
    CleanupCompaction(this,compact);
    Compaction::ReleaseInputs(local_150);
    DeleteObsoleteFiles(this);
LAB_00ceea85:
    Compaction::~Compaction(local_150);
  }
  operator_delete(local_150,0x158);
  if (local_128.state_ == (pointer)0x0) {
    SVar12.state_ = (pointer)0x0;
  }
  else {
    SVar12.state_ = local_128.state_;
    if (((this->shutting_down_)._M_base._M_i & 1U) == 0) {
      pLVar5 = (this->options_).info_log;
      Status::ToString_abi_cxx11_((string *)local_120,&local_128);
      Log(pLVar5,"Compaction error: %s",local_120._0_8_);
      SVar12.state_ = local_128.state_;
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        SVar12.state_ = local_128.state_;
      }
    }
  }
  if (pMVar3 != (ManualCompaction *)0x0) {
    pMVar3 = this->manual_compaction_;
    if (SVar12.state_ == (pointer)0x0) {
      if ((pMVar3->done & 1U) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&(pMVar3->tmp_storage).rep_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        pMVar3->begin = &pMVar3->tmp_storage;
      }
    }
    else {
      pMVar3->done = true;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
    SVar12.state_ = local_128.state_;
  }
  if (SVar12.state_ != (pointer)0x0) {
    operator_delete__(SVar12.state_);
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
  }
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) ==
      (__pthread_internal_list *)local_58._32_8_) {
    return;
  }
LAB_00ceed52:
  __stack_chk_fail();
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}